

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O2

void StdStringStreamWithRewind<unsigned_short>(void)

{
  long lVar1;
  ostream *poVar2;
  ushort uVar3;
  stringstream local_1d8 [8];
  stringstream ss;
  ostream local_1c8 [8];
  string local_1c0 [368];
  double local_50;
  ResultType _result;
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> _prof;
  
  std::__cxx11::stringstream::stringstream(local_1d8);
  _result.__r = (rep)&_prof.mStart;
  std::__cxx11::string::_M_construct((ulong)&_result,'@');
  std::__cxx11::stringbuf::str(local_1c0);
  std::__cxx11::string::~string((string *)&_result);
  poVar2 = std::operator<<((ostream *)&std::cout,"[");
  poVar2 = std::operator<<(poVar2,_endl<char,std::char_traits<char>> +
                                  (*_endl<char,std::char_traits<char>> == '*'));
  poVar2 = std::operator<<(poVar2,"] ");
  poVar2 = std::operator<<(poVar2,"std::stringstream with rewind");
  std::operator<<(poVar2,"... ");
  std::ostream::flush();
  _result.__r = (rep)&local_50;
  _prof.mResult = (duration<double,_std::ratio<1L,_1L>_> *)std::chrono::_V2::steady_clock::now();
  uVar3 = 0;
  while ((ushort)(uVar3 + 1) != 0) {
    std::ostream::seekp(local_1c8,0,0);
    std::ostream::operator<<(local_1c8,uVar3);
    uVar3 = uVar3 + 1;
  }
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::~Profiler
            ((Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)&_result);
  lVar1 = std::cout;
  *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 3;
  poVar2 = std::ostream::_M_insert<double>(local_50);
  poVar2 = std::operator<<(poVar2,"s");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::stringstream::~stringstream(local_1d8);
  return;
}

Assistant:

void StdStringStreamWithRewind()
{
    std::stringstream ss;
    ss.str(std::string(64, '0'));
    PROFILING_BEGIN(T, "std::stringstream with rewind")
    ss.seekp(0);
    ss << i;
    PROFILING_END()
}